

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxFacts.cpp
# Opt level: O3

bool slang::syntax::SyntaxFacts::isCloseDelimOrKeyword(TokenKind kind)

{
  undefined2 in_register_0000003a;
  
  if (((0x12 < CONCAT22(in_register_0000003a,kind) - 0x8eU) &&
      (2 < CONCAT22(in_register_0000003a,kind) - 0xcaU)) &&
     ((0x12 < CONCAT22(in_register_0000003a,kind) || ((0x54000U >> (kind & 0x1f) & 1) == 0)))) {
    return false;
  }
  return true;
}

Assistant:

bool SyntaxFacts::isCloseDelimOrKeyword(TokenKind kind) {
    switch (kind) {
        case TokenKind::CloseBrace:
        case TokenKind::CloseBracket:
        case TokenKind::CloseParenthesis:
            return true;
        default:
            return isEndKeyword(kind);
    }
}